

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hudmessages.cpp
# Opt level: O3

void __thiscall
DHUDMessage::DHUDMessage
          (DHUDMessage *this,FFont *font,char *text,float x,float y,int hudwidth,int hudheight,
          EColorRange textColor,float holdTime)

{
  uint uVar1;
  char *pcVar2;
  float fVar3;
  float intpart;
  float local_34;
  
  DObject::DObject(&this->super_DObject);
  (this->super_DObject)._vptr_DObject = (_func_int **)&PTR_StaticType_00708220;
  if (hudwidth == 0 || hudheight == 0) {
    this->HUDWidth = 0;
    this->HUDHeight = 0;
    if (ABS(x) <= 2.0) {
      if (-1.0 <= x) {
        fVar3 = (float)(~-(uint)(1.0 < x) & (uint)x | (uint)(x + -1.0) & -(uint)(1.0 < x));
      }
      else {
        fVar3 = x + 1.0;
      }
      this->Left = fVar3;
      if (ABS(x) <= 1.0) {
        this->CenterX = false;
      }
      else {
        this->CenterX = true;
      }
    }
    else {
      this->CenterX = true;
      this->Left = 0.5;
    }
  }
  else {
    this->Top = y;
    this->HUDWidth = hudwidth;
    this->HUDHeight = hudheight;
    fVar3 = modff(x,&local_34);
    uVar1 = (uint)(ABS(fVar3) * 10.0 + 0.5);
    this->CenterX = (bool)((byte)uVar1 >> 2 & 1);
    fVar3 = (float)(uVar1 & 3) / 10.0;
    this->Left = (float)(~-(uint)(0.0 < x) & (uint)-fVar3 | (uint)fVar3 & -(uint)(0.0 < x)) +
                 local_34;
  }
  this->NoWrap = false;
  this->ClipX = 0;
  this->ClipY = 0;
  this->ClipWidth = 0;
  this->ClipHeight = 0;
  this->WrapWidth = 0;
  this->HandleAspect = true;
  this->Top = y;
  (this->Next).field_0.p = (DHUDMessage *)0x0;
  this->Lines = (FBrokenLines *)0x0;
  this->HoldTics = (int)(holdTime * 35.0);
  this->Tics = 0;
  this->State = 0;
  this->TextColor = textColor;
  pcVar2 = copystring(text);
  this->SourceText = pcVar2;
  this->Font = font;
  this->VisibilityFlags = 0;
  this->Style = LegacyRenderStyles[6];
  this->Alpha = 1.0;
  (*(this->super_DObject)._vptr_DObject[7])(this,pcVar2);
  return;
}

Assistant:

DHUDMessage::DHUDMessage (FFont *font, const char *text, float x, float y, int hudwidth, int hudheight,
						  EColorRange textColor, float holdTime)
{
	if (hudwidth == 0 || hudheight == 0)
	{
		// for y range [-1.0, 0.0]: Positions top edge of box
		// for y range [0.0, 1.0]: Positions center of box
		// for x range [-2.0, -1.0]: Positions left edge of box, and centers text inside it
		// for x range [-1.0, 0.0]: Positions left edge of box
		// for x range [0.0, 1.0]: Positions center of box
		// for x range [1.0, 2.0]: Positions center of box, and centers text inside it
		HUDWidth = HUDHeight = 0;
		if (fabs (x) > 2.f)
		{
			CenterX = true;
			Left = 0.5f;
		}
		else
		{
			Left = x < -1.f ? x + 1.f : x > 1.f ? x - 1.f : x;
			if (fabs(x) > 1.f)
			{
				CenterX = true;
			}
			else
			{
				CenterX = false;
			}
		}
	}
	else
	{ // HUD size is specified, so coordinates are in pixels, but you can add
	  // some fractions to affect positioning:
	  // For y: .1 = positions top edge of box
	  //		.2 = positions bottom edge of box
	  // For x: .1 = positions left edge of box
	  //        .2 = positions right edge of box
	  //		.4 = centers text inside box
	  //			 .4 can also be added to either .1 or .2
		Top = y;
		HUDWidth = hudwidth;
		HUDHeight = hudheight;
		
		float intpart;
		int fracpart = (int)(fabsf (modff (x, &intpart)) * 10.f + 0.5f);
		if (fracpart & 4)
		{
			CenterX = true;
		}
		else
		{
			CenterX = false;
		}
		if (x > 0)
		{
			Left = intpart + (float)(fracpart & 3) / 10.f;
		}
		else
		{
			Left = intpart - (float)(fracpart & 3) / 10.f;
		}
	}
	NoWrap = false;
	ClipX = ClipY = ClipWidth = ClipHeight = 0;
	WrapWidth = 0;
	HandleAspect = true;
	Top = y;
	Next = NULL;
	Lines = NULL;
	HoldTics = (int)(holdTime * TICRATE);
	Tics = 0;
	TextColor = textColor;
	State = 0;
	SourceText = copystring (text);
	Font = font;
	VisibilityFlags = 0;
	Style = STYLE_Translucent;
	Alpha = 1.;
	ResetText (SourceText);
}